

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_audio.c
# Opt level: O2

void glob_audio_properties(t_pd *dummy,t_floatarg flongform)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  char *outdevlist_00;
  char *pcVar5;
  int noutdevs;
  ulong local_89f8;
  int cancallback;
  int canmulti;
  int nindevs;
  ulong local_89e0;
  ulong local_89d8;
  ulong local_89d0;
  ulong local_89c8;
  ulong local_89c0;
  ulong local_89b8;
  ulong local_89b0;
  ulong local_89a8;
  ulong local_89a0;
  char blocksize [80];
  char callback [80];
  char srate [80];
  t_audiosettings as;
  char *outdevs [128];
  char *indevs [128];
  char outdevlist [16384];
  char indevlist [16384];
  
  local_89f8 = CONCAT44(local_89f8._4_4_,flongform);
  nindevs = 0;
  noutdevs = 0;
  canmulti = 0;
  cancallback = 0;
  pcVar5 = indevlist;
  outdevlist_00 = outdevlist;
  sys_get_audio_devs(pcVar5,&nindevs,outdevlist_00,&noutdevs,&canmulti,&cancallback,0x80,0x80,
                     audio_nextsettings.a_api);
  uVar3 = (ulong)(uint)nindevs;
  uVar2 = 0;
  uVar4 = 0;
  if (0 < nindevs) {
    uVar4 = (ulong)(uint)nindevs;
  }
  for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    indevs[uVar2] = pcVar5;
    pcVar5 = pcVar5 + 0x80;
  }
  uVar2 = 0;
  uVar4 = 0;
  if (0 < noutdevs) {
    uVar4 = (ulong)(uint)noutdevs;
  }
  for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    outdevs[uVar2] = outdevlist_00;
    outdevlist_00 = outdevlist_00 + 0x80;
  }
  if (nindevs == 0) {
    nindevs = 1;
    indevs[0] = "";
    uVar3 = 1;
  }
  if (noutdevs == 0) {
    noutdevs = 1;
    outdevs[0] = "";
  }
  pdgui_vmess("set","rS","::audio_indevlist",uVar3,indevs);
  pdgui_vmess("set","rS","::audio_outdevlist",(ulong)(uint)noutdevs,outdevs);
  sys_get_audio_settings(&as);
  bVar1 = (float)local_89f8 != 0.0;
  sprintf(srate,"%s%d","",(ulong)(uint)as.a_srate);
  pcVar5 = "!";
  if (cancallback != 0) {
    pcVar5 = "";
  }
  sprintf(callback,"%s%d",pcVar5,(ulong)(uint)as.a_callback);
  sprintf(blocksize,"%s%d","",(ulong)(uint)as.a_blocksize);
  pdgui_stub_deleteforkey((void *)0x0);
  local_89f8 = (ulong)(uint)as.a_indevvec[2];
  local_89a0 = (ulong)(uint)as.a_indevvec[3];
  local_89a8 = (ulong)(uint)as.a_chindevvec[0];
  local_89b0 = (ulong)(uint)as.a_chindevvec[1];
  local_89b8 = (ulong)(uint)as.a_chindevvec[2];
  local_89c0 = (ulong)(uint)as.a_chindevvec[3];
  local_89c8 = (ulong)(uint)as.a_outdevvec[0];
  local_89d0 = (ulong)(uint)as.a_outdevvec[1];
  local_89d8 = (ulong)(uint)as.a_outdevvec[2];
  local_89e0 = (ulong)(uint)as.a_outdevvec[3];
  pdgui_stub_vnew(&glob_pdobject,"pdtk_audio_dialog",glob_audio_properties,
                  "iiii iiii iiii iiii  s ii s i s",(ulong)(uint)as.a_indevvec[0],
                  (ulong)(uint)as.a_indevvec[1],local_89f8,local_89a0,local_89a8,local_89b0,
                  local_89b8,local_89c0,local_89c8,local_89d0,local_89d8,local_89e0,
                  (ulong)(uint)as.a_choutdevvec[0],(ulong)(uint)as.a_choutdevvec[1],
                  (ulong)(uint)as.a_choutdevvec[2],(ulong)(uint)as.a_choutdevvec[3],srate,
                  (ulong)(uint)as.a_advance,(ulong)(uint)canmulti,callback,
                  (ulong)(bVar1 || (1 < as.a_noutdev || 1 < as.a_nindev)),blocksize);
  return;
}

Assistant:

void glob_audio_properties(t_pd *dummy, t_floatarg flongform)
{
    t_audiosettings as;
        /* these are all the devices on your system: */
    char indevlist[MAXNDEV*DEVDESCSIZE], outdevlist[MAXNDEV*DEVDESCSIZE];
    char device[MAXPDSTRING];
    char *indevs[MAXNDEV], *outdevs[MAXNDEV];
    int nindevs = 0, noutdevs = 0, canmulti = 0, cancallback = 0, i;
    char srate[80], callback[80], blocksize[80];

    sys_get_audio_devs(indevlist, &nindevs, outdevlist, &noutdevs, &canmulti,
         &cancallback, MAXNDEV, DEVDESCSIZE, audio_nextsettings.a_api);

    for (i = 0; i < nindevs; i++)
        indevs[i] = indevlist + i * DEVDESCSIZE;
    for (i = 0; i < noutdevs; i++)
        outdevs[i] = outdevlist + i * DEVDESCSIZE;

    if(!nindevs) {
        nindevs = 1;
        indevs[0] = "";
    }
    if(!noutdevs) {
        noutdevs = 1;
        outdevs[0] = "";
    }

    pdgui_vmess("set", "rS",
            "::audio_indevlist",
            nindevs, indevs);
    pdgui_vmess("set", "rS",
            "::audio_outdevlist",
            noutdevs, outdevs);

    sys_get_audio_settings(&as);

    if (as.a_nindev > 1 || as.a_noutdev > 1)
        flongform = 1;

    sprintf(srate, "%s%d", audio_isfixedsr(as.a_api)?"!":"", as.a_srate);
    sprintf(callback, "%s%d", cancallback?"":"!", as.a_callback);
    sprintf(blocksize, "%s%d", audio_isfixedblocksize(as.a_api)?"!":"", as.a_blocksize);

        /* values that are fixed and must not be changed by the GUI are
        prefixed with '!';  * the GUI will then display these values but
        disable their widgets */
    pdgui_stub_deleteforkey(0);
    pdgui_stub_vnew(&glob_pdobject,
        "pdtk_audio_dialog", (void *)glob_audio_properties,
        "iiii iiii iiii iiii  s ii s i s",
        as.a_indevvec   [0], as.a_indevvec   [1], as.a_indevvec   [2], as.a_indevvec   [3],
        as.a_chindevvec [0], as.a_chindevvec [1], as.a_chindevvec [2], as.a_chindevvec [3],
        as.a_outdevvec  [0], as.a_outdevvec  [1], as.a_outdevvec  [2], as.a_outdevvec  [3],
        as.a_choutdevvec[0], as.a_choutdevvec[1], as.a_choutdevvec[2], as.a_choutdevvec[3],
        srate,
        as.a_advance, canmulti,
        callback,
        (flongform != 0),
        blocksize);
}